

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O0

void add_existing_impl(_Bool change_udata)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined1 local_3d [8];
  epoll_event event_result;
  uint8_t data;
  int ec_1;
  int ec;
  epoll_event event;
  int fds [3];
  int ep;
  _Bool change_udata_local;
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x21d,"ep >= 0");
  }
  fd_pipe(&event.data.fd);
  ec_1 = 1;
  ec = 0x2a;
  iVar2 = epoll_ctl(iVar1,1,event.data.fd,(epoll_event *)&ec_1);
  if (iVar2 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x226,"epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) == 0");
  }
  if (change_udata) {
    ec = 0x2b;
  }
  iVar2 = epoll_ctl(iVar1,1,event.data.fd,(epoll_event *)&ec_1);
  if (-1 < iVar2) {
    microatf_fail_require
              ("%s:%d: Expected true value in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x22d,"epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) < 0");
  }
  piVar3 = __errno_location();
  unique0x00011f80 = *piVar3;
  if (unique0x00011f80 != 0x11) {
    microatf_fail_require
              ("%s:%d: Expected errno %d, got %d, in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x22d,0x11,unique0x00011f80,"epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) < 0");
  }
  iVar2 = epoll_ctl(iVar1,1,event.data.fd,(epoll_event *)&ec_1);
  if (-1 < iVar2) {
    microatf_fail_require
              ("%s:%d: Expected true value in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x22f,"epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) < 0");
  }
  piVar3 = __errno_location();
  event_result.data.u64._1_4_ = *piVar3;
  if (event_result.data.u64._1_4_ != 0x11) {
    microatf_fail_require
              ("%s:%d: Expected errno %d, got %d, in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x22f,0x11,event_result.data.u64._1_4_,
               "epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) < 0");
  }
  event_result.data.fd._0_1_ = 0;
  write(event.data.u64._4_4_,&event_result.data,1);
  iVar2 = epoll_wait(iVar1,(epoll_event *)local_3d,1,-1);
  if (iVar2 != 1) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x235,"epoll_wait(ep, &event_result, 1, -1) == 1");
  }
  if (local_3d._4_4_ != 0x2a) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x237,"event_result.data.u32 == 42");
  }
  iVar2 = close(event.data.fd);
  if (iVar2 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x239,"close(fds[0]) == 0");
  }
  iVar2 = close(event.data.u64._4_4_);
  if (iVar2 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x23a,"close(fds[1]) == 0");
  }
  if (fds[0] != -1) {
    iVar2 = close(fds[0]);
    if (iVar2 != 0) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                 ,0x23b,"fds[2] == -1 || close(fds[2]) == 0");
    }
  }
  iVar1 = close(iVar1);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x23c,"close(ep) == 0");
  }
  return;
}

Assistant:

static void
add_existing_impl(bool change_udata)
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	int fds[3];
	fd_pipe(fds);

	struct epoll_event event;
	event.events = EPOLLIN;
	event.data.u32 = 42;

	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) == 0);

	if (change_udata) {
		event.data.u32 = 43;
	}

	ATF_REQUIRE_ERRNO(EEXIST,
	    epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) < 0);
	ATF_REQUIRE_ERRNO(EEXIST,
	    epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) < 0);

	uint8_t data = '\0';
	write(fds[1], &data, 1);

	struct epoll_event event_result;
	ATF_REQUIRE(epoll_wait(ep, &event_result, 1, -1) == 1);

	ATF_REQUIRE(event_result.data.u32 == 42);

	ATF_REQUIRE(close(fds[0]) == 0);
	ATF_REQUIRE(close(fds[1]) == 0);
	ATF_REQUIRE(fds[2] == -1 || close(fds[2]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}